

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O3

void __thiscall
hand::createHand(hand *this,stack<card,_std::deque<card,_std::allocator<card>_>_> *deck)

{
  pointer pcVar1;
  _Elt_pointer pcVar2;
  int iVar3;
  card temp;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pcVar2 == (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data
             ._M_finish._M_node[-1] + 10;
  }
  local_60._8_4_ = pcVar2[-1].value;
  local_60[0] = pcVar2[-1].bolted;
  local_60._1_3_ = *(undefined3 *)&pcVar2[-1].field_0x1;
  local_60._4_4_ = pcVar2[-1].cardType;
  local_50._M_p = local_40;
  pcVar1 = pcVar2[-1].name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + pcVar2[-1].name._M_string_length);
  iVar3 = 10;
  do {
    pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data
             ._M_finish._M_cur;
    if (pcVar2 == (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar2 = (deck->c).super__Deque_base<card,_std::allocator<card>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    local_60._8_4_ = pcVar2[-1].value;
    local_60[0] = pcVar2[-1].bolted;
    local_60._1_3_ = *(undefined3 *)&pcVar2[-1].field_0x1;
    local_60._4_4_ = pcVar2[-1].cardType;
    std::__cxx11::string::_M_assign((string *)&local_50);
    if (local_60._4_4_ == 0) {
      this->regularCards = this->regularCards + 1;
    }
    else {
      this->specialCards = this->specialCards + 1;
    }
    std::vector<card,_std::allocator<card>_>::push_back(&this->hand_,(value_type *)local_60);
    std::deque<card,_std::allocator<card>_>::pop_back(&deck->c);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void hand::createHand(stack<card> &deck) {
    card temp = deck.top();
    for(int i = 0; i < START_HAND_QUANTITY; i++) {
        temp = deck.top();
        if (isRegularCard(temp)) setRegularCards(1+getRegularCards());
        else setSpecialCards(1+getSpecialCards());
        hand_.push_back(temp);
        deck.pop();
    }
}